

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O0

void __thiscall merlin::em::run(em *this)

{
  ostream *poVar1;
  void *this_00;
  EVP_PKEY_CTX *in_RSI;
  double dVar2;
  double dVar3;
  double delta;
  double dStack_20;
  int i;
  double loglikelihood;
  double timeStart;
  em *this_local;
  
  init(this,in_RSI);
  poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Begin parameter learning ...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar2 = timeSystem();
  dStack_20 = 0.0;
  delta._4_4_ = 0;
  do {
    if (this->m_iterations <= delta._4_4_) {
LAB_001f4f9b:
      poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Finished parameter learning");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Time elapsed is ");
      dVar3 = timeSystem();
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 - dVar2);
      poVar1 = std::operator<<(poVar1," seconds");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      return;
    }
    e_step(this);
    m_step(this);
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,delta._4_4_);
    poVar1 = std::operator<<(poVar1,": log-likelihood = ");
    this_00 = (void *)std::ostream::operator<<(poVar1,this->m_loglikelihood);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if (ABS(this->m_loglikelihood - dStack_20) <= this->m_epsilon) {
      poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Converged to log-likelihood ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_loglikelihood);
      poVar1 = std::operator<<(poVar1," after ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,delta._4_4_);
      poVar1 = std::operator<<(poVar1," iterations");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      goto LAB_001f4f9b;
    }
    dStack_20 = this->m_loglikelihood;
    delta._4_4_ = delta._4_4_ + 1;
  } while( true );
}

Assistant:

void em::run() {

	// Initialize the algorithm
	init();
	std::cout << "[EM] Begin parameter learning ..." << std::endl;
	double timeStart = timeSystem();

	// Iterate the e-step and the m-step over the dataset
	double loglikelihood = 0;
	for (int i = 0; i < m_iterations; ++i) {
		e_step();
		m_step();
		std::cout << " " << i << ": log-likelihood = " << m_loglikelihood << std::endl;

		double delta = std::fabs(m_loglikelihood - loglikelihood);
		if (delta <= m_epsilon) {
			std::cout << "[EM] Converged to log-likelihood "
					<< m_loglikelihood << " after " << i << " iterations" << std::endl;
			break; // converged skip this for now
		}

		loglikelihood = m_loglikelihood;
	}

	std::cout << "[EM] Finished parameter learning" << std::endl;
	std::cout << "[EM] Time elapsed is " << (timeSystem() - timeStart) << " seconds" << std::endl;
}